

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O3

void __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
::drop_empty_range(semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
                   *this,outer_range_iterator empty_range)

{
  iterator_range<std::_List_iterator<char>_> *piVar1;
  
  piVar1 = (this->m_begin)._M_current;
  if (this->m_min_items < (ulong)((long)(this->m_end)._M_current - (long)piVar1 >> 4)) {
    std::_V2::
    __rotate<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>>*,std::vector<boost::iterator_range<std::_List_iterator<char>>,std::allocator<boost::iterator_range<std::_List_iterator<char>>>>>>
              (empty_range._M_current,empty_range._M_current + 1);
    (this->m_end)._M_current = (this->m_end)._M_current + -1;
    maintain_invariant(this);
    return;
  }
  (this->m_end)._M_current = piVar1;
  return;
}

Assistant:

void drop_empty_range (outer_range_iterator empty_range)
        {
            if (range_count() > m_min_items)
            {
                std::rotate(empty_range, std::next(empty_range), m_end);
                --m_end;

                maintain_invariant();
            }
            else
            {
                scroll_to_end();
            }
        }